

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fixLeafParent(Rtree *pRtree,RtreeNode *pLeaf)

{
  int iVar1;
  sqlite3_int64 iNode_00;
  bool bVar2;
  i64 iNode;
  RtreeNode *pTest;
  RtreeNode *pRStack_28;
  int rc2;
  RtreeNode *pChild;
  int rc;
  RtreeNode *pLeaf_local;
  Rtree *pRtree_local;
  
  pChild._4_4_ = 0;
  pRStack_28 = pLeaf;
  while( true ) {
    bVar2 = false;
    if ((pChild._4_4_ == 0) && (bVar2 = false, pRStack_28->iNode != 1)) {
      bVar2 = pRStack_28->pParent == (RtreeNode *)0x0;
    }
    if (!bVar2) break;
    pTest._4_4_ = 0;
    sqlite3_bind_int64(pRtree->pReadParent,1,pRStack_28->iNode);
    iVar1 = sqlite3_step(pRtree->pReadParent);
    if (iVar1 == 100) {
      iNode_00 = sqlite3_column_int64(pRtree->pReadParent,0);
      iNode = (i64)pLeaf;
      while( true ) {
        bVar2 = false;
        if (iNode != 0) {
          bVar2 = *(long *)(iNode + 8) != iNode_00;
        }
        if (!bVar2) break;
        iNode = *(i64 *)iNode;
      }
      if (iNode == 0) {
        pTest._4_4_ = nodeAcquire(pRtree,iNode_00,(RtreeNode *)0x0,&pRStack_28->pParent);
      }
    }
    pChild._4_4_ = sqlite3_reset(pRtree->pReadParent);
    if (pChild._4_4_ == 0) {
      pChild._4_4_ = pTest._4_4_;
    }
    if ((pChild._4_4_ == 0) && (pRStack_28->pParent == (RtreeNode *)0x0)) {
      pChild._4_4_ = 0x10b;
    }
    pRStack_28 = pRStack_28->pParent;
  }
  return pChild._4_4_;
}

Assistant:

static int fixLeafParent(Rtree *pRtree, RtreeNode *pLeaf){
  int rc = SQLITE_OK;
  RtreeNode *pChild = pLeaf;
  while( rc==SQLITE_OK && pChild->iNode!=1 && pChild->pParent==0 ){
    int rc2 = SQLITE_OK;          /* sqlite3_reset() return code */
    sqlite3_bind_int64(pRtree->pReadParent, 1, pChild->iNode);
    rc = sqlite3_step(pRtree->pReadParent);
    if( rc==SQLITE_ROW ){
      RtreeNode *pTest;           /* Used to test for reference loops */
      i64 iNode;                  /* Node number of parent node */

      /* Before setting pChild->pParent, test that we are not creating a
      ** loop of references (as we would if, say, pChild==pParent). We don't
      ** want to do this as it leads to a memory leak when trying to delete
      ** the referenced counted node structures.
      */
      iNode = sqlite3_column_int64(pRtree->pReadParent, 0);
      for(pTest=pLeaf; pTest && pTest->iNode!=iNode; pTest=pTest->pParent);
      if( !pTest ){
        rc2 = nodeAcquire(pRtree, iNode, 0, &pChild->pParent);
      }
    }
    rc = sqlite3_reset(pRtree->pReadParent);
    if( rc==SQLITE_OK ) rc = rc2;
    if( rc==SQLITE_OK && !pChild->pParent ){
      RTREE_IS_CORRUPT(pRtree);
      rc = SQLITE_CORRUPT_VTAB;
    }
    pChild = pChild->pParent;
  }
  return rc;
}